

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O2

sds sdsRemoveFreeSpace(sds s)

{
  byte bVar1;
  byte type;
  uint uVar2;
  uint uVar3;
  size_t string_size;
  void *pvVar4;
  size_t __size;
  ulong uVar5;
  sds s_00;
  
  bVar1 = s[-1];
  string_size = sdslen(s);
  uVar2 = sdsHdrSize(bVar1 & 7);
  type = sdsReqType(string_size);
  uVar3 = sdsHdrSize(type);
  uVar5 = (ulong)uVar3;
  __size = string_size + uVar5 + 1;
  if ((bVar1 & 7) == type) {
    pvVar4 = realloc(s + -(ulong)uVar2,__size);
    if (pvVar4 == (void *)0x0) {
      return (sds)0x0;
    }
    s_00 = (sds)((long)pvVar4 + uVar5);
  }
  else {
    pvVar4 = malloc(__size);
    if (pvVar4 == (void *)0x0) {
      return (sds)0x0;
    }
    s_00 = (sds)((long)pvVar4 + uVar5);
    memcpy(s_00,s,string_size + 1);
    free(s + -(ulong)uVar2);
    *(byte *)((long)pvVar4 + (uVar5 - 1)) = type;
    sdssetlen(s_00,string_size);
  }
  sdssetalloc(s_00,string_size);
  return s_00;
}

Assistant:

sds sdsRemoveFreeSpace(sds s) {
    void *sh, *newsh;
    char type, oldtype = s[-1] & SDS_TYPE_MASK;
    int hdrlen;
    size_t len = sdslen(s);
    sh = (char*)s-sdsHdrSize(oldtype);

    type = sdsReqType(len);
    hdrlen = sdsHdrSize(type);
    if (oldtype==type) {
        newsh = s_realloc(sh, hdrlen+len+1);
        if (newsh == NULL) return NULL;
        s = (char*)newsh+hdrlen;
    } else {
        newsh = s_malloc(hdrlen+len+1);
        if (newsh == NULL) return NULL;
        memcpy((char*)newsh+hdrlen, s, len+1);
        s_free(sh);
        s = (char*)newsh+hdrlen;
        s[-1] = type;
        sdssetlen(s, len);
    }
    sdssetalloc(s, len);
    return s;
}